

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::collapseAll(QTreeView *this)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  char cVar4;
  ulong uVar5;
  QHash<QPersistentModelIndex,_QHashDummyValue> *other;
  long in_FS_OFFSET;
  QMetaMethod local_58;
  piter local_40;
  QHash<QPersistentModelIndex,_QHashDummyValue> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  other = (QHash<QPersistentModelIndex,_QHashDummyValue> *)
          (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                     super_QWidget.field_0x8 + 0x5d8);
  local_30.d = (Data *)0x0;
  QHash<QPersistentModelIndex,_QHashDummyValue>::operator=(&local_30,other);
  QHash<QPersistentModelIndex,_QHashDummyValue>::clear(other);
  if ((*(byte *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget.field_0x8 + 0x30) & 2) == 0) {
    local_58 = QMetaMethod::fromSignal<void(QTreeView::*)(QModelIndex_const&)>
                         ((QMetaMethod *)collapsed,0);
    cVar4 = QObject::isSignalConnected((QMetaMethod *)this);
    if (cVar4 != '\0') {
      local_40 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::constBegin(&local_30);
      while( true ) {
        if (local_40.d == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0
            && local_40.bucket == 0) break;
        pSVar2 = (local_40.d)->spans;
        uVar5 = local_40.bucket >> 7;
        bVar1 = pSVar2[uVar5].offsets[(uint)local_40.bucket & 0x7f];
        pEVar3 = pSVar2[uVar5].entries;
        cVar4 = QPersistentModelIndex::isValid();
        if (cVar4 != '\0') {
          cVar4 = QPersistentModelIndex::flags();
          if (-1 < cVar4) {
            QPersistentModelIndex::operator_cast_to_QModelIndex
                      ((QModelIndex *)&local_58,(QPersistentModelIndex *)(pEVar3 + bVar1));
            collapsed(this,(QModelIndex *)&local_58);
          }
        }
        QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
        operator++(&local_40);
      }
    }
  }
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x220))(this);
  QHash<QPersistentModelIndex,_QHashDummyValue>::~QHash(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::collapseAll()
{
    Q_D(QTreeView);
    QSet<QPersistentModelIndex> old_expandedIndexes;
    old_expandedIndexes = d->expandedIndexes;
    d->expandedIndexes.clear();
    if (!signalsBlocked() && isSignalConnected(QMetaMethod::fromSignal(&QTreeView::collapsed))) {
        QSet<QPersistentModelIndex>::const_iterator i = old_expandedIndexes.constBegin();
        for (; i != old_expandedIndexes.constEnd(); ++i) {
            const QPersistentModelIndex &mi = (*i);
            if (mi.isValid() && !(mi.flags() & Qt::ItemNeverHasChildren))
                emit collapsed(mi);
        }
    }
    doItemsLayout();
}